

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O0

ze_result_t
validation_layer::zeDeviceGet
          (ze_driver_handle_t hDriver,uint32_t *pCount,ze_device_handle_t *phDevices)

{
  code *pcVar1;
  ze_result_t zVar2;
  ze_result_t result_00;
  element_type *this;
  size_type sVar3;
  reference ppvVar4;
  pointer pHVar5;
  bool bVar6;
  ulong local_a0;
  size_t i_2;
  size_type sStack_90;
  ze_result_t result_2;
  size_t i_1;
  ze_result_t driver_result;
  ze_result_t result_1;
  ze_result_t result;
  size_t i;
  size_type numValHandlers;
  ze_pfnDeviceGet_t pfnGet;
  allocator local_49;
  string local_48 [32];
  ze_device_handle_t *local_28;
  ze_device_handle_t *phDevices_local;
  uint32_t *pCount_local;
  ze_driver_handle_t hDriver_local;
  
  local_28 = phDevices;
  phDevices_local = (ze_device_handle_t *)pCount;
  pCount_local = (uint32_t *)hDriver;
  this = std::__shared_ptr_access<loader::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<loader::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                    )(context + 0xd50));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"zeDeviceGet(hDriver, pCount, phDevices)",&local_49);
  loader::Logger::log_trace(this,(string *)local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  pcVar1 = *(code **)(context + 0xe8);
  if (pcVar1 == (code *)0x0) {
    hDriver_local._4_4_ = logAndPropagateResult("zeDeviceGet",ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);
  }
  else {
    sVar3 = std::
            vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
            ::size((vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                    *)(context + 0xd30));
    for (_result_1 = 0; _result_1 < sVar3; _result_1 = _result_1 + 1) {
      ppvVar4 = std::
                vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                ::operator[]((vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                              *)(context + 0xd30),_result_1);
      zVar2 = (*(*ppvVar4)->zeValidation->_vptr_ZEValidationEntryPoints[0x12])
                        ((*ppvVar4)->zeValidation,pCount_local,phDevices_local);
      if (zVar2 != ZE_RESULT_SUCCESS) {
        zVar2 = logAndPropagateResult("zeDeviceGet",zVar2);
        return zVar2;
      }
    }
    if ((*(byte *)(context + 4) & 1) != 0) {
      pHVar5 = std::
               unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
               ::operator->((unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
                             *)(context + 0xd48));
      zVar2 = ZEHandleLifetimeValidation::zeDeviceGetPrologue
                        (&pHVar5->zeHandleLifetime,(ze_driver_handle_t)pCount_local,
                         (uint32_t *)phDevices_local,local_28);
      if (zVar2 != ZE_RESULT_SUCCESS) {
        zVar2 = logAndPropagateResult("zeDeviceGet",zVar2);
        return zVar2;
      }
    }
    zVar2 = (*pcVar1)(pCount_local,phDevices_local,local_28);
    for (sStack_90 = 0; sStack_90 < sVar3; sStack_90 = sStack_90 + 1) {
      ppvVar4 = std::
                vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                ::operator[]((vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                              *)(context + 0xd30),sStack_90);
      result_00 = (*(*ppvVar4)->zeValidation->_vptr_ZEValidationEntryPoints[0x13])
                            ((*ppvVar4)->zeValidation,pCount_local,phDevices_local,local_28,
                             (ulong)zVar2);
      if (result_00 != ZE_RESULT_SUCCESS) {
        zVar2 = logAndPropagateResult("zeDeviceGet",result_00);
        return zVar2;
      }
    }
    if ((zVar2 == ZE_RESULT_SUCCESS) && ((*(byte *)(context + 4) & 1) != 0)) {
      local_a0 = 0;
      while( true ) {
        bVar6 = false;
        if (local_28 != (ze_device_handle_t *)0x0) {
          bVar6 = local_a0 < *(uint *)phDevices_local;
        }
        if (!bVar6) break;
        if (local_28[local_a0] != (ze_device_handle_t)0x0) {
          pHVar5 = std::
                   unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
                   ::operator->((unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
                                 *)(context + 0xd48));
          HandleLifetimeValidation::addHandle(pHVar5,local_28[local_a0]);
          pHVar5 = std::
                   unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
                   ::operator->((unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
                                 *)(context + 0xd48));
          HandleLifetimeValidation::addDependent(pHVar5,pCount_local,local_28[local_a0]);
        }
        local_a0 = local_a0 + 1;
      }
    }
    hDriver_local._4_4_ = logAndPropagateResult("zeDeviceGet",zVar2);
  }
  return hDriver_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeDeviceGet(
        ze_driver_handle_t hDriver,                     ///< [in] handle of the driver instance
        uint32_t* pCount,                               ///< [in,out] pointer to the number of devices.
                                                        ///< if count is zero, then the driver shall update the value with the
                                                        ///< total number of devices available.
                                                        ///< if count is greater than the number of devices available, then the
                                                        ///< driver shall update the value with the correct number of devices available.
        ze_device_handle_t* phDevices                   ///< [in,out][optional][range(0, *pCount)] array of handle of devices.
                                                        ///< if count is less than the number of devices available, then driver
                                                        ///< shall only retrieve that number of devices.
        )
    {
        context.logger->log_trace("zeDeviceGet(hDriver, pCount, phDevices)");

        auto pfnGet = context.zeDdiTable.Device.pfnGet;

        if( nullptr == pfnGet )
            return logAndPropagateResult("zeDeviceGet", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeDeviceGetPrologue( hDriver, pCount, phDevices );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeDeviceGet", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zeHandleLifetime.zeDeviceGetPrologue( hDriver, pCount, phDevices );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeDeviceGet", result);
        }

        auto driver_result = pfnGet( hDriver, pCount, phDevices );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeDeviceGetEpilogue( hDriver, pCount, phDevices ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeDeviceGet", result);
        }


        if( driver_result == ZE_RESULT_SUCCESS && context.enableHandleLifetime ){
            
            for (size_t i = 0; ( nullptr != phDevices) && (i < *pCount); ++i){
                if (phDevices[i]){
                    context.handleLifetime->addHandle( phDevices[i] );
                    context.handleLifetime->addDependent( hDriver, phDevices[i] );
                }
            }
        }
        return logAndPropagateResult("zeDeviceGet", driver_result);
    }